

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::ServiceDescriptorProto::MergeFrom
          (ServiceDescriptorProto *this,ServiceDescriptorProto *from)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  MethodDescriptorProto *from_00;
  void **ppvVar5;
  LogMessage *other;
  MethodDescriptorProto *this_00;
  string *psVar6;
  ServiceOptions *pSVar7;
  long lVar8;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0xf3e);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->method_).super_RepeatedPtrFieldBase,
             (from->method_).super_RepeatedPtrFieldBase.current_size_ +
             (this->method_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->method_).super_RepeatedPtrFieldBase.current_size_) {
    lVar8 = 0;
    do {
      from_00 = (MethodDescriptorProto *)(from->method_).super_RepeatedPtrFieldBase.elements_[lVar8]
      ;
      iVar3 = (this->method_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (this->method_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar5 = (this->method_).super_RepeatedPtrFieldBase.elements_;
        (this->method_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        this_00 = (MethodDescriptorProto *)ppvVar5[iVar3];
      }
      else {
        iVar3 = (this->method_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->method_).super_RepeatedPtrFieldBase,iVar3 + 1);
        }
        piVar1 = &(this->method_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>::New();
        ppvVar5 = (this->method_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->method_).super_RepeatedPtrFieldBase.current_size_;
        (this->method_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar5[iVar3] = this_00;
      }
      MethodDescriptorProto::MergeFrom(this_00,from_00);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (from->method_).super_RepeatedPtrFieldBase.current_size_);
  }
  bVar2 = (byte)from->_has_bits_[0];
  if (bVar2 != 0) {
    if ((bVar2 & 1) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 1;
      if (this->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar6 = (string *)operator_new(0x20);
        (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
        psVar6->_M_string_length = 0;
        (psVar6->field_2)._M_local_buf[0] = '\0';
        this->name_ = psVar6;
      }
      std::__cxx11::string::_M_assign((string *)this->name_);
    }
    if ((from->_has_bits_[0] & 4) != 0) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
      if (this->options_ == (ServiceOptions *)0x0) {
        pSVar7 = (ServiceOptions *)operator_new(0x60);
        ServiceOptions::ServiceOptions(pSVar7);
        this->options_ = pSVar7;
      }
      pSVar7 = from->options_;
      if (pSVar7 == (ServiceOptions *)0x0) {
        pSVar7 = *(ServiceOptions **)(default_instance_ + 0x30);
      }
      ServiceOptions::MergeFrom(this->options_,pSVar7);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void ServiceDescriptorProto::MergeFrom(const ServiceDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  method_.MergeFrom(from.method_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_options()) {
      mutable_options()->::google::protobuf::ServiceOptions::MergeFrom(from.options());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}